

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getTimingTagBlocking
          (CLIntercept *this,char *functionName,cl_bool blocking,size_t size,string *hostTag,
          string *deviceTag)

{
  SConfig *pSVar1;
  long in_RCX;
  int in_EDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  string *in_R8;
  string *in_R9;
  char s [256];
  char local_138 [264];
  string *local_30;
  string *local_28;
  long local_20;
  int local_14;
  char *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::reserve((ulong)in_R9);
  std::__cxx11::string::operator=(local_30,local_10);
  if (local_20 != 0) {
    pSVar1 = config(in_RDI);
    if ((pSVar1->DevicePerformanceTimeTransferTracking & 1U) != 0) {
      snprintf(local_138,0x100,"( %zu bytes )",local_20);
      std::__cxx11::string::operator+=(local_30,local_138);
    }
  }
  if (local_14 == 1) {
    std::__cxx11::string::operator+=(local_28,"blocking");
  }
  return;
}

Assistant:

void CLIntercept::getTimingTagBlocking(
    const char* functionName,
    const cl_bool blocking,
    const size_t size,
    std::string& hostTag,
    std::string& deviceTag )
{
    deviceTag.reserve(128);
    deviceTag = functionName;

    if( size && config().DevicePerformanceTimeTransferTracking )
    {
        char    s[256];
        CLI_SPRINTF( s, 256, "( %zu bytes )", size );
        deviceTag += s;
    }

    if( blocking == CL_TRUE )
    {
        hostTag += "blocking";
    }
}